

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O0

void __thiscall
rcdiscover::SocketLinux::SocketLinux
          (SocketLinux *this,int domain,int type,int protocol,in_addr_t dst_ip,uint16_t port,
          string *iface_name)

{
  uint16_t uVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  allocator<char> *in_RDI;
  undefined4 in_R8D;
  uint16_t in_R9W;
  string *in_stack_00000008;
  int yes;
  string *in_stack_ffffffffffffff18;
  Socket<rcdiscover::SocketLinux> *in_stack_ffffffffffffff20;
  string *this_00;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff67;
  int in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  SocketException *in_stack_ffffffffffffff80;
  undefined4 local_78;
  undefined1 local_72;
  string local_40 [38];
  uint16_t local_1a;
  undefined4 local_18;
  int local_14;
  int local_10;
  int local_c;
  
  this_00 = local_40;
  local_1a = in_R9W;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::__cxx11::string::string(this_00,in_stack_00000008);
  Socket<rcdiscover::SocketLinux>::Socket(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_40);
  *(undefined4 *)(in_RDI + 0x20) = 0xffffffff;
  memset(in_RDI + 0x24,0,0x10);
  iVar2 = socket(local_c,local_10,local_14);
  *(int *)(in_RDI + 0x20) = iVar2;
  if (*(int *)(in_RDI + 0x20) != -1) {
    *(undefined4 *)(in_RDI + 0x28) = local_18;
    *(undefined2 *)(in_RDI + 0x24) = 2;
    uVar1 = htons(local_1a);
    *(uint16_t *)(in_RDI + 0x26) = uVar1;
    local_78 = 1;
    iVar2 = setsockopt(*(int *)(in_RDI + 0x20),1,0xf,&local_78,4);
    if (iVar2 == -1) {
      uVar5 = 1;
      uVar4 = __cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff67,CONCAT16(uVar5,in_stack_ffffffffffffff60)),
                 (char *)this_00,in_RDI);
      __errno_location();
      SocketException::SocketException
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      __cxa_throw(uVar4,&SocketException::typeinfo,SocketException::~SocketException);
    }
    return;
  }
  piVar3 = __errno_location();
  if (*piVar3 == 1) {
    uVar4 = __cxa_allocate_exception(0x10);
    OperationNotPermitted::OperationNotPermitted((OperationNotPermitted *)in_stack_ffffffffffffff20)
    ;
    __cxa_throw(uVar4,&OperationNotPermitted::typeinfo,OperationNotPermitted::~OperationNotPermitted
               );
  }
  local_72 = 1;
  uVar4 = __cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),(char *)this_00
             ,in_RDI);
  __errno_location();
  SocketException::SocketException
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  local_72 = 0;
  __cxa_throw(uVar4,&SocketException::typeinfo,SocketException::~SocketException);
}

Assistant:

SocketLinux::SocketLinux(int domain, int type, int protocol,
                         in_addr_t dst_ip, uint16_t port,
                         std::string iface_name) :
  Socket(std::move(iface_name)),
  sock_(-1),
  dst_addr_()
{
  sock_ = ::socket(domain, type, protocol);
  if (sock_ == -1)
  {
    if (errno == EPERM)
    {
      throw OperationNotPermitted();
    }

    throw SocketException("Error while creating socket", errno);
  }

  dst_addr_.sin_addr.s_addr = dst_ip;
  dst_addr_.sin_family = AF_INET;
  dst_addr_.sin_port = htons(port);

  const int yes = 1;
  if (::setsockopt(sock_,
                  SOL_SOCKET,
                  SO_REUSEPORT,
                  reinterpret_cast<const char *>(&yes),
                  sizeof(yes)) == -1)
  {
    throw SocketException("Error while setting socket options", errno);
  }
}